

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaExporter.cpp
# Opt level: O0

void __thiscall Assimp::ColladaExporter::WriteMaterials(ColladaExporter *this)

{
  undefined8 uVar1;
  __type _Var2;
  bool bVar3;
  aiReturn aVar4;
  char *pcVar5;
  reference pvVar6;
  reference pcVar7;
  ulong uVar8;
  ostream *poVar9;
  Surface *pSVar10;
  Property *pPVar11;
  string local_ac8;
  string local_aa8;
  reference local_a88;
  Material *mat_3;
  __normal_iterator<Assimp::ColladaExporter::Material_*,_std::vector<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>_>
  local_a78;
  __normal_iterator<const_Assimp::ColladaExporter::Material_*,_std::vector<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>_>
  local_a70;
  const_iterator it_3;
  allocator local_a41;
  string local_a40;
  allocator local_a19;
  string local_a18;
  allocator local_9f1;
  string local_9f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9d0;
  allocator local_9a9;
  string local_9a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_988;
  allocator local_961;
  string local_960;
  allocator local_939;
  string local_938;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_918;
  allocator local_8f1;
  string local_8f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8d0;
  allocator local_8a9;
  string local_8a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_888;
  allocator local_861;
  string local_860;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_840;
  allocator local_819;
  string local_818;
  allocator local_7f1;
  string local_7f0;
  allocator local_7c9;
  string local_7c8;
  allocator local_7a1;
  string local_7a0;
  allocator local_779;
  string local_778;
  allocator local_751;
  string local_750;
  allocator local_729;
  string local_728;
  allocator local_701;
  string local_700;
  string local_6e0;
  string local_6c0;
  reference local_6a0;
  Material *mat_2;
  __normal_iterator<Assimp::ColladaExporter::Material_*,_std::vector<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>_>
  local_690;
  __normal_iterator<const_Assimp::ColladaExporter::Material_*,_std::vector<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>_>
  local_688;
  const_iterator it_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_660;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_640;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_620;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_600;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5c0;
  reference local_5a0;
  Material *mat_1;
  __normal_iterator<Assimp::ColladaExporter::Material_*,_std::vector<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>_>
  local_590;
  __normal_iterator<const_Assimp::ColladaExporter::Material_*,_std::vector<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>_>
  local_588;
  const_iterator it_1;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_578;
  aiShadingMode shading;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_570;
  iterator it;
  allocator local_541;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_540;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_520;
  aiMaterial *local_500;
  size_t i;
  size_t materialCountWithThisName;
  undefined1 local_4e8 [8];
  string testName;
  allocator local_491;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_490;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_470;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_450;
  undefined1 local_42c [8];
  aiString name;
  aiMaterial *mat;
  size_t a;
  size_t numTextures;
  ColladaExporter *this_local;
  
  std::vector<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
  ::resize(&this->materials,(ulong)this->mScene->mNumMaterials);
  a = 0;
  for (mat = (aiMaterial *)0x0; mat < (aiMaterial *)(ulong)this->mScene->mNumMaterials;
      mat = (aiMaterial *)((long)&mat->mProperties + 1)) {
    name.data._1016_8_ = this->mScene->mMaterials[(long)mat];
    aiString::aiString((aiString *)local_42c);
    aVar4 = aiMaterial::Get((aiMaterial *)name.data._1016_8_,"?mat.name",0,0,(aiString *)local_42c);
    if (aVar4 == aiReturn_SUCCESS) {
      pcVar5 = aiString::C_Str((aiString *)local_42c);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)local_4e8,pcVar5,(allocator *)((long)&materialCountWithThisName + 7));
      std::allocator<char>::~allocator((allocator<char> *)((long)&materialCountWithThisName + 7));
      i = 0;
      for (local_500 = (aiMaterial *)0x0; local_500 < mat;
          local_500 = (aiMaterial *)((long)&local_500->mProperties + 1)) {
        pvVar6 = std::
                 vector<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
                 ::operator[](&this->materials,(size_type)local_500);
        _Var2 = std::operator==(&pvVar6->name,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_4e8);
        if (_Var2) {
          i = i + 1;
        }
      }
      if (i == 0) {
        pcVar5 = aiString::C_Str((aiString *)local_42c);
        pvVar6 = std::
                 vector<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
                 ::operator[](&this->materials,(size_type)mat);
        std::__cxx11::string::operator=((string *)pvVar6,pcVar5);
      }
      else {
        pcVar5 = aiString::C_Str((aiString *)local_42c);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_540,pcVar5,&local_541);
        to_string<unsigned_long>((string *)&it,i);
        std::operator+(&local_520,&local_540,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&it);
        pvVar6 = std::
                 vector<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
                 ::operator[](&this->materials,(size_type)mat);
        std::__cxx11::string::operator=((string *)pvVar6,(string *)&local_520);
        std::__cxx11::string::~string((string *)&local_520);
        std::__cxx11::string::~string((string *)&it);
        std::__cxx11::string::~string((string *)&local_540);
        std::allocator<char>::~allocator((allocator<char> *)&local_541);
      }
      std::__cxx11::string::~string((string *)local_4e8);
    }
    else {
      aiString::operator=((aiString *)local_42c,"mat");
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_490,"m",&local_491);
      to_string<unsigned_long>((string *)((long)&testName.field_2 + 8),(unsigned_long)mat);
      std::operator+(&local_470,&local_490,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&testName.field_2 + 8));
      pcVar5 = aiString::C_Str((aiString *)local_42c);
      std::operator+(&local_450,&local_470,pcVar5);
      pvVar6 = std::
               vector<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
               ::operator[](&this->materials,(size_type)mat);
      std::__cxx11::string::operator=((string *)pvVar6,(string *)&local_450);
      std::__cxx11::string::~string((string *)&local_450);
      std::__cxx11::string::~string((string *)&local_470);
      std::__cxx11::string::~string((string *)(testName.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)&local_490);
      std::allocator<char>::~allocator((allocator<char> *)&local_491);
    }
    std::
    vector<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>::
    operator[](&this->materials,(size_type)mat);
    local_570._M_current = (char *)std::__cxx11::string::begin();
    while( true ) {
      std::
      vector<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
      ::operator[](&this->materials,(size_type)mat);
      _Stack_578._M_current = (char *)std::__cxx11::string::end();
      bVar3 = __gnu_cxx::operator!=(&local_570,&stack0xfffffffffffffa88);
      if (!bVar3) break;
      pcVar7 = __gnu_cxx::
               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_570);
      bVar3 = isalnum_C(*pcVar7);
      if (!bVar3) {
        pcVar7 = __gnu_cxx::
                 __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&local_570);
        *pcVar7 = '_';
      }
      __gnu_cxx::
      __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&local_570);
    }
    it_1._M_current._4_4_ = 1;
    pvVar6 = std::
             vector<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
             ::operator[](&this->materials,(size_type)mat);
    std::__cxx11::string::operator=((string *)&pvVar6->shading_model,"phong");
    aVar4 = aiMaterial::Get<aiShadingMode>
                      ((aiMaterial *)name.data._1016_8_,"$mat.shadingm",0,0,
                       (aiShadingMode *)((long)&it_1._M_current + 4));
    if (aVar4 == aiReturn_SUCCESS) {
      if (it_1._M_current._4_4_ == 3) {
        pvVar6 = std::
                 vector<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
                 ::operator[](&this->materials,(size_type)mat);
        std::__cxx11::string::operator=((string *)&pvVar6->shading_model,"phong");
      }
      else if (it_1._M_current._4_4_ == 4) {
        pvVar6 = std::
                 vector<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
                 ::operator[](&this->materials,(size_type)mat);
        std::__cxx11::string::operator=((string *)&pvVar6->shading_model,"blinn");
      }
      else if (it_1._M_current._4_4_ == 9) {
        pvVar6 = std::
                 vector<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
                 ::operator[](&this->materials,(size_type)mat);
        std::__cxx11::string::operator=((string *)&pvVar6->shading_model,"constant");
      }
      else if (it_1._M_current._4_4_ == 2) {
        pvVar6 = std::
                 vector<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
                 ::operator[](&this->materials,(size_type)mat);
        std::__cxx11::string::operator=((string *)&pvVar6->shading_model,"lambert");
      }
    }
    pvVar6 = std::
             vector<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
             ::operator[](&this->materials,(size_type)mat);
    ReadMaterialSurface(this,&pvVar6->ambient,(aiMaterial *)name.data._1016_8_,aiTextureType_AMBIENT
                        ,"$clr.ambient",0,0);
    std::
    vector<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>::
    operator[](&this->materials,(size_type)mat);
    uVar8 = std::__cxx11::string::empty();
    if ((uVar8 & 1) == 0) {
      a = a + 1;
    }
    pvVar6 = std::
             vector<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
             ::operator[](&this->materials,(size_type)mat);
    ReadMaterialSurface(this,&pvVar6->diffuse,(aiMaterial *)name.data._1016_8_,aiTextureType_DIFFUSE
                        ,"$clr.diffuse",0,0);
    std::
    vector<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>::
    operator[](&this->materials,(size_type)mat);
    uVar8 = std::__cxx11::string::empty();
    if ((uVar8 & 1) == 0) {
      a = a + 1;
    }
    pvVar6 = std::
             vector<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
             ::operator[](&this->materials,(size_type)mat);
    ReadMaterialSurface(this,&pvVar6->specular,(aiMaterial *)name.data._1016_8_,
                        aiTextureType_SPECULAR,"$clr.specular",0,0);
    std::
    vector<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>::
    operator[](&this->materials,(size_type)mat);
    uVar8 = std::__cxx11::string::empty();
    if ((uVar8 & 1) == 0) {
      a = a + 1;
    }
    pvVar6 = std::
             vector<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
             ::operator[](&this->materials,(size_type)mat);
    ReadMaterialSurface(this,&pvVar6->emissive,(aiMaterial *)name.data._1016_8_,
                        aiTextureType_EMISSIVE,"$clr.emissive",0,0);
    std::
    vector<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>::
    operator[](&this->materials,(size_type)mat);
    uVar8 = std::__cxx11::string::empty();
    if ((uVar8 & 1) == 0) {
      a = a + 1;
    }
    pvVar6 = std::
             vector<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
             ::operator[](&this->materials,(size_type)mat);
    ReadMaterialSurface(this,&pvVar6->reflective,(aiMaterial *)name.data._1016_8_,
                        aiTextureType_REFLECTION,"$clr.reflective",0,0);
    std::
    vector<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>::
    operator[](&this->materials,(size_type)mat);
    uVar8 = std::__cxx11::string::empty();
    if ((uVar8 & 1) == 0) {
      a = a + 1;
    }
    pvVar6 = std::
             vector<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
             ::operator[](&this->materials,(size_type)mat);
    ReadMaterialSurface(this,&pvVar6->transparent,(aiMaterial *)name.data._1016_8_,
                        aiTextureType_OPACITY,"$clr.transparent",0,0);
    std::
    vector<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>::
    operator[](&this->materials,(size_type)mat);
    uVar8 = std::__cxx11::string::empty();
    if ((uVar8 & 1) == 0) {
      a = a + 1;
    }
    pvVar6 = std::
             vector<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
             ::operator[](&this->materials,(size_type)mat);
    ReadMaterialSurface(this,&pvVar6->normal,(aiMaterial *)name.data._1016_8_,aiTextureType_NORMALS,
                        (char *)0x0,0,0);
    std::
    vector<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>::
    operator[](&this->materials,(size_type)mat);
    uVar8 = std::__cxx11::string::empty();
    uVar1 = name.data._1016_8_;
    if ((uVar8 & 1) == 0) {
      a = a + 1;
    }
    pvVar6 = std::
             vector<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
             ::operator[](&this->materials,(size_type)mat);
    aVar4 = aiMaterial::Get((aiMaterial *)uVar1,"$mat.shininess",0,0,&(pvVar6->shininess).value);
    pvVar6 = std::
             vector<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
             ::operator[](&this->materials,(size_type)mat);
    uVar1 = name.data._1016_8_;
    (pvVar6->shininess).exist = aVar4 == aiReturn_SUCCESS;
    pvVar6 = std::
             vector<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
             ::operator[](&this->materials,(size_type)mat);
    aVar4 = aiMaterial::Get((aiMaterial *)uVar1,"$mat.opacity",0,0,&(pvVar6->transparency).value);
    pvVar6 = std::
             vector<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
             ::operator[](&this->materials,(size_type)mat);
    uVar1 = name.data._1016_8_;
    (pvVar6->transparency).exist = aVar4 == aiReturn_SUCCESS;
    pvVar6 = std::
             vector<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
             ::operator[](&this->materials,(size_type)mat);
    aVar4 = aiMaterial::Get((aiMaterial *)uVar1,"$mat.refracti",0,0,
                            &(pvVar6->index_refraction).value);
    pvVar6 = std::
             vector<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
             ::operator[](&this->materials,(size_type)mat);
    (pvVar6->index_refraction).exist = aVar4 == aiReturn_SUCCESS;
  }
  if (a != 0) {
    poVar9 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
    poVar9 = std::operator<<(poVar9,"<library_images>");
    std::operator<<(poVar9,(string *)&this->endstr);
    PushTag(this);
    local_590._M_current =
         (Material *)
         std::
         vector<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
         ::begin(&this->materials);
    __gnu_cxx::
    __normal_iterator<Assimp::ColladaExporter::Material_const*,std::vector<Assimp::ColladaExporter::Material,std::allocator<Assimp::ColladaExporter::Material>>>
    ::__normal_iterator<Assimp::ColladaExporter::Material*>
              ((__normal_iterator<Assimp::ColladaExporter::Material_const*,std::vector<Assimp::ColladaExporter::Material,std::allocator<Assimp::ColladaExporter::Material>>>
                *)&local_588,&local_590);
    while( true ) {
      mat_1 = (Material *)
              std::
              vector<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
              ::end(&this->materials);
      bVar3 = __gnu_cxx::operator!=
                        (&local_588,
                         (__normal_iterator<Assimp::ColladaExporter::Material_*,_std::vector<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>_>
                          *)&mat_1);
      if (!bVar3) break;
      local_5a0 = __gnu_cxx::
                  __normal_iterator<const_Assimp::ColladaExporter::Material_*,_std::vector<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>_>
                  ::operator*(&local_588);
      pSVar10 = &local_5a0->ambient;
      std::operator+(&local_5c0,&local_5a0->name,"-ambient-image");
      WriteImageEntry(this,pSVar10,&local_5c0);
      std::__cxx11::string::~string((string *)&local_5c0);
      pSVar10 = &local_5a0->diffuse;
      std::operator+(&local_5e0,&local_5a0->name,"-diffuse-image");
      WriteImageEntry(this,pSVar10,&local_5e0);
      std::__cxx11::string::~string((string *)&local_5e0);
      pSVar10 = &local_5a0->specular;
      std::operator+(&local_600,&local_5a0->name,"-specular-image");
      WriteImageEntry(this,pSVar10,&local_600);
      std::__cxx11::string::~string((string *)&local_600);
      pSVar10 = &local_5a0->emissive;
      std::operator+(&local_620,&local_5a0->name,"-emission-image");
      WriteImageEntry(this,pSVar10,&local_620);
      std::__cxx11::string::~string((string *)&local_620);
      pSVar10 = &local_5a0->reflective;
      std::operator+(&local_640,&local_5a0->name,"-reflective-image");
      WriteImageEntry(this,pSVar10,&local_640);
      std::__cxx11::string::~string((string *)&local_640);
      pSVar10 = &local_5a0->transparent;
      std::operator+(&local_660,&local_5a0->name,"-transparent-image");
      WriteImageEntry(this,pSVar10,&local_660);
      std::__cxx11::string::~string((string *)&local_660);
      pSVar10 = &local_5a0->normal;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&it_2,
                     &local_5a0->name,"-normal-image");
      WriteImageEntry(this,pSVar10,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&it_2);
      std::__cxx11::string::~string((string *)&it_2);
      __gnu_cxx::
      __normal_iterator<const_Assimp::ColladaExporter::Material_*,_std::vector<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>_>
      ::operator++(&local_588);
    }
    PopTag(this);
    poVar9 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
    poVar9 = std::operator<<(poVar9,"</library_images>");
    std::operator<<(poVar9,(string *)&this->endstr);
  }
  bVar3 = std::
          vector<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
          ::empty(&this->materials);
  if (!bVar3) {
    poVar9 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
    poVar9 = std::operator<<(poVar9,"<library_effects>");
    std::operator<<(poVar9,(string *)&this->endstr);
    PushTag(this);
    local_690._M_current =
         (Material *)
         std::
         vector<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
         ::begin(&this->materials);
    __gnu_cxx::
    __normal_iterator<Assimp::ColladaExporter::Material_const*,std::vector<Assimp::ColladaExporter::Material,std::allocator<Assimp::ColladaExporter::Material>>>
    ::__normal_iterator<Assimp::ColladaExporter::Material*>
              ((__normal_iterator<Assimp::ColladaExporter::Material_const*,std::vector<Assimp::ColladaExporter::Material,std::allocator<Assimp::ColladaExporter::Material>>>
                *)&local_688,&local_690);
    while( true ) {
      mat_2 = (Material *)
              std::
              vector<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
              ::end(&this->materials);
      bVar3 = __gnu_cxx::operator!=
                        (&local_688,
                         (__normal_iterator<Assimp::ColladaExporter::Material_*,_std::vector<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>_>
                          *)&mat_2);
      if (!bVar3) break;
      local_6a0 = __gnu_cxx::
                  __normal_iterator<const_Assimp::ColladaExporter::Material_*,_std::vector<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>_>
                  ::operator*(&local_688);
      poVar9 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
      poVar9 = std::operator<<(poVar9,"<effect id=\"");
      XMLEscape(&local_6c0,&local_6a0->name);
      poVar9 = std::operator<<(poVar9,(string *)&local_6c0);
      poVar9 = std::operator<<(poVar9,"-fx\" name=\"");
      XMLEscape(&local_6e0,&local_6a0->name);
      poVar9 = std::operator<<(poVar9,(string *)&local_6e0);
      poVar9 = std::operator<<(poVar9,"\">");
      std::operator<<(poVar9,(string *)&this->endstr);
      std::__cxx11::string::~string((string *)&local_6e0);
      std::__cxx11::string::~string((string *)&local_6c0);
      PushTag(this);
      poVar9 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
      poVar9 = std::operator<<(poVar9,"<profile_COMMON>");
      std::operator<<(poVar9,(string *)&this->endstr);
      PushTag(this);
      pSVar10 = &local_6a0->emissive;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_700,"emission",&local_701);
      WriteTextureParamEntry(this,pSVar10,&local_700,&local_6a0->name);
      std::__cxx11::string::~string((string *)&local_700);
      std::allocator<char>::~allocator((allocator<char> *)&local_701);
      pSVar10 = &local_6a0->ambient;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_728,"ambient",&local_729);
      WriteTextureParamEntry(this,pSVar10,&local_728,&local_6a0->name);
      std::__cxx11::string::~string((string *)&local_728);
      std::allocator<char>::~allocator((allocator<char> *)&local_729);
      pSVar10 = &local_6a0->diffuse;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_750,"diffuse",&local_751);
      WriteTextureParamEntry(this,pSVar10,&local_750,&local_6a0->name);
      std::__cxx11::string::~string((string *)&local_750);
      std::allocator<char>::~allocator((allocator<char> *)&local_751);
      pSVar10 = &local_6a0->specular;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_778,"specular",&local_779);
      WriteTextureParamEntry(this,pSVar10,&local_778,&local_6a0->name);
      std::__cxx11::string::~string((string *)&local_778);
      std::allocator<char>::~allocator((allocator<char> *)&local_779);
      pSVar10 = &local_6a0->reflective;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_7a0,"reflective",&local_7a1);
      WriteTextureParamEntry(this,pSVar10,&local_7a0,&local_6a0->name);
      std::__cxx11::string::~string((string *)&local_7a0);
      std::allocator<char>::~allocator((allocator<char> *)&local_7a1);
      pSVar10 = &local_6a0->transparent;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_7c8,"transparent",&local_7c9);
      WriteTextureParamEntry(this,pSVar10,&local_7c8,&local_6a0->name);
      std::__cxx11::string::~string((string *)&local_7c8);
      std::allocator<char>::~allocator((allocator<char> *)&local_7c9);
      pSVar10 = &local_6a0->normal;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_7f0,"normal",&local_7f1);
      WriteTextureParamEntry(this,pSVar10,&local_7f0,&local_6a0->name);
      std::__cxx11::string::~string((string *)&local_7f0);
      std::allocator<char>::~allocator((allocator<char> *)&local_7f1);
      poVar9 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
      poVar9 = std::operator<<(poVar9,"<technique sid=\"standard\">");
      std::operator<<(poVar9,(string *)&this->endstr);
      PushTag(this);
      poVar9 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
      poVar9 = std::operator<<(poVar9,"<");
      poVar9 = std::operator<<(poVar9,(string *)&local_6a0->shading_model);
      poVar9 = std::operator<<(poVar9,">");
      std::operator<<(poVar9,(string *)&this->endstr);
      PushTag(this);
      pSVar10 = &local_6a0->emissive;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_818,"emission",&local_819);
      std::operator+(&local_840,&local_6a0->name,"-emission-sampler");
      WriteTextureColorEntry(this,pSVar10,&local_818,&local_840);
      std::__cxx11::string::~string((string *)&local_840);
      std::__cxx11::string::~string((string *)&local_818);
      std::allocator<char>::~allocator((allocator<char> *)&local_819);
      pSVar10 = &local_6a0->ambient;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_860,"ambient",&local_861);
      std::operator+(&local_888,&local_6a0->name,"-ambient-sampler");
      WriteTextureColorEntry(this,pSVar10,&local_860,&local_888);
      std::__cxx11::string::~string((string *)&local_888);
      std::__cxx11::string::~string((string *)&local_860);
      std::allocator<char>::~allocator((allocator<char> *)&local_861);
      pSVar10 = &local_6a0->diffuse;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_8a8,"diffuse",&local_8a9);
      std::operator+(&local_8d0,&local_6a0->name,"-diffuse-sampler");
      WriteTextureColorEntry(this,pSVar10,&local_8a8,&local_8d0);
      std::__cxx11::string::~string((string *)&local_8d0);
      std::__cxx11::string::~string((string *)&local_8a8);
      std::allocator<char>::~allocator((allocator<char> *)&local_8a9);
      pSVar10 = &local_6a0->specular;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_8f0,"specular",&local_8f1);
      std::operator+(&local_918,&local_6a0->name,"-specular-sampler");
      WriteTextureColorEntry(this,pSVar10,&local_8f0,&local_918);
      std::__cxx11::string::~string((string *)&local_918);
      std::__cxx11::string::~string((string *)&local_8f0);
      std::allocator<char>::~allocator((allocator<char> *)&local_8f1);
      pPVar11 = &local_6a0->shininess;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_938,"shininess",&local_939);
      WriteFloatEntry(this,pPVar11,&local_938);
      std::__cxx11::string::~string((string *)&local_938);
      std::allocator<char>::~allocator((allocator<char> *)&local_939);
      pSVar10 = &local_6a0->reflective;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_960,"reflective",&local_961);
      std::operator+(&local_988,&local_6a0->name,"-reflective-sampler");
      WriteTextureColorEntry(this,pSVar10,&local_960,&local_988);
      std::__cxx11::string::~string((string *)&local_988);
      std::__cxx11::string::~string((string *)&local_960);
      std::allocator<char>::~allocator((allocator<char> *)&local_961);
      pSVar10 = &local_6a0->transparent;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_9a8,"transparent",&local_9a9);
      std::operator+(&local_9d0,&local_6a0->name,"-transparent-sampler");
      WriteTextureColorEntry(this,pSVar10,&local_9a8,&local_9d0);
      std::__cxx11::string::~string((string *)&local_9d0);
      std::__cxx11::string::~string((string *)&local_9a8);
      std::allocator<char>::~allocator((allocator<char> *)&local_9a9);
      pPVar11 = &local_6a0->transparency;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_9f0,"transparency",&local_9f1);
      WriteFloatEntry(this,pPVar11,&local_9f0);
      std::__cxx11::string::~string((string *)&local_9f0);
      std::allocator<char>::~allocator((allocator<char> *)&local_9f1);
      pPVar11 = &local_6a0->index_refraction;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_a18,"index_of_refraction",&local_a19);
      WriteFloatEntry(this,pPVar11,&local_a18);
      std::__cxx11::string::~string((string *)&local_a18);
      std::allocator<char>::~allocator((allocator<char> *)&local_a19);
      uVar8 = std::__cxx11::string::empty();
      if ((uVar8 & 1) == 0) {
        pSVar10 = &local_6a0->normal;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_a40,"bump",&local_a41);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&it_3,
                       &local_6a0->name,"-normal-sampler");
        WriteTextureColorEntry(this,pSVar10,&local_a40,(string *)&it_3);
        std::__cxx11::string::~string((string *)&it_3);
        std::__cxx11::string::~string((string *)&local_a40);
        std::allocator<char>::~allocator((allocator<char> *)&local_a41);
      }
      PopTag(this);
      poVar9 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
      poVar9 = std::operator<<(poVar9,"</");
      poVar9 = std::operator<<(poVar9,(string *)&local_6a0->shading_model);
      poVar9 = std::operator<<(poVar9,">");
      std::operator<<(poVar9,(string *)&this->endstr);
      PopTag(this);
      poVar9 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
      poVar9 = std::operator<<(poVar9,"</technique>");
      std::operator<<(poVar9,(string *)&this->endstr);
      PopTag(this);
      poVar9 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
      poVar9 = std::operator<<(poVar9,"</profile_COMMON>");
      std::operator<<(poVar9,(string *)&this->endstr);
      PopTag(this);
      poVar9 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
      poVar9 = std::operator<<(poVar9,"</effect>");
      std::operator<<(poVar9,(string *)&this->endstr);
      __gnu_cxx::
      __normal_iterator<const_Assimp::ColladaExporter::Material_*,_std::vector<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>_>
      ::operator++(&local_688);
    }
    PopTag(this);
    poVar9 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
    poVar9 = std::operator<<(poVar9,"</library_effects>");
    std::operator<<(poVar9,(string *)&this->endstr);
    poVar9 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
    poVar9 = std::operator<<(poVar9,"<library_materials>");
    std::operator<<(poVar9,(string *)&this->endstr);
    PushTag(this);
    local_a78._M_current =
         (Material *)
         std::
         vector<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
         ::begin(&this->materials);
    __gnu_cxx::
    __normal_iterator<Assimp::ColladaExporter::Material_const*,std::vector<Assimp::ColladaExporter::Material,std::allocator<Assimp::ColladaExporter::Material>>>
    ::__normal_iterator<Assimp::ColladaExporter::Material*>
              ((__normal_iterator<Assimp::ColladaExporter::Material_const*,std::vector<Assimp::ColladaExporter::Material,std::allocator<Assimp::ColladaExporter::Material>>>
                *)&local_a70,&local_a78);
    while( true ) {
      mat_3 = (Material *)
              std::
              vector<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
              ::end(&this->materials);
      bVar3 = __gnu_cxx::operator!=
                        (&local_a70,
                         (__normal_iterator<Assimp::ColladaExporter::Material_*,_std::vector<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>_>
                          *)&mat_3);
      if (!bVar3) break;
      local_a88 = __gnu_cxx::
                  __normal_iterator<const_Assimp::ColladaExporter::Material_*,_std::vector<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>_>
                  ::operator*(&local_a70);
      poVar9 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
      poVar9 = std::operator<<(poVar9,"<material id=\"");
      XMLEscape(&local_aa8,&local_a88->name);
      poVar9 = std::operator<<(poVar9,(string *)&local_aa8);
      poVar9 = std::operator<<(poVar9,"\" name=\"");
      poVar9 = std::operator<<(poVar9,(string *)local_a88);
      poVar9 = std::operator<<(poVar9,"\">");
      std::operator<<(poVar9,(string *)&this->endstr);
      std::__cxx11::string::~string((string *)&local_aa8);
      PushTag(this);
      poVar9 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
      poVar9 = std::operator<<(poVar9,"<instance_effect url=\"#");
      XMLEscape(&local_ac8,&local_a88->name);
      poVar9 = std::operator<<(poVar9,(string *)&local_ac8);
      poVar9 = std::operator<<(poVar9,"-fx\"/>");
      std::operator<<(poVar9,(string *)&this->endstr);
      std::__cxx11::string::~string((string *)&local_ac8);
      PopTag(this);
      poVar9 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
      poVar9 = std::operator<<(poVar9,"</material>");
      std::operator<<(poVar9,(string *)&this->endstr);
      __gnu_cxx::
      __normal_iterator<const_Assimp::ColladaExporter::Material_*,_std::vector<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>_>
      ::operator++(&local_a70);
    }
    PopTag(this);
    poVar9 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
    poVar9 = std::operator<<(poVar9,"</library_materials>");
    std::operator<<(poVar9,(string *)&this->endstr);
  }
  return;
}

Assistant:

void ColladaExporter::WriteMaterials()
{
  materials.resize( mScene->mNumMaterials);

  /// collect all materials from the scene
  size_t numTextures = 0;
  for( size_t a = 0; a < mScene->mNumMaterials; ++a )
  {
    const aiMaterial* mat = mScene->mMaterials[a];

    aiString name;
    if( mat->Get( AI_MATKEY_NAME, name) != aiReturn_SUCCESS ) {
      name = "mat";
      materials[a].name = std::string( "m") + to_string(a) + name.C_Str();
    } else {
      // try to use the material's name if no other material has already taken it, else append #
      std::string testName = name.C_Str();
      size_t materialCountWithThisName = 0;
      for( size_t i = 0; i < a; i ++ ) {
        if( materials[i].name == testName ) {
          materialCountWithThisName ++;
        }
      }
      if( materialCountWithThisName == 0 ) {
        materials[a].name = name.C_Str();
      } else {
        materials[a].name = std::string(name.C_Str()) + to_string(materialCountWithThisName);
      }
    }
    for( std::string::iterator it = materials[a].name.begin(); it != materials[a].name.end(); ++it ) {
      if( !isalnum_C( *it ) ) {
        *it = '_';
      }
    }

    aiShadingMode shading = aiShadingMode_Flat;
    materials[a].shading_model = "phong";
    if(mat->Get( AI_MATKEY_SHADING_MODEL, shading) == aiReturn_SUCCESS) {
        if(shading == aiShadingMode_Phong) {
            materials[a].shading_model = "phong";
        } else if(shading == aiShadingMode_Blinn) {
            materials[a].shading_model = "blinn";
        } else if(shading == aiShadingMode_NoShading) {
            materials[a].shading_model = "constant";
        } else if(shading == aiShadingMode_Gouraud) {
            materials[a].shading_model = "lambert";
        }
    }

    ReadMaterialSurface( materials[a].ambient, mat, aiTextureType_AMBIENT, AI_MATKEY_COLOR_AMBIENT);
    if( !materials[a].ambient.texture.empty() ) numTextures++;
    ReadMaterialSurface( materials[a].diffuse, mat, aiTextureType_DIFFUSE, AI_MATKEY_COLOR_DIFFUSE);
    if( !materials[a].diffuse.texture.empty() ) numTextures++;
    ReadMaterialSurface( materials[a].specular, mat, aiTextureType_SPECULAR, AI_MATKEY_COLOR_SPECULAR);
    if( !materials[a].specular.texture.empty() ) numTextures++;
    ReadMaterialSurface( materials[a].emissive, mat, aiTextureType_EMISSIVE, AI_MATKEY_COLOR_EMISSIVE);
    if( !materials[a].emissive.texture.empty() ) numTextures++;
    ReadMaterialSurface( materials[a].reflective, mat, aiTextureType_REFLECTION, AI_MATKEY_COLOR_REFLECTIVE);
    if( !materials[a].reflective.texture.empty() ) numTextures++;
    ReadMaterialSurface( materials[a].transparent, mat, aiTextureType_OPACITY, AI_MATKEY_COLOR_TRANSPARENT);
    if( !materials[a].transparent.texture.empty() ) numTextures++;
    ReadMaterialSurface( materials[a].normal, mat, aiTextureType_NORMALS, NULL, 0, 0);
    if( !materials[a].normal.texture.empty() ) numTextures++;

    materials[a].shininess.exist = mat->Get( AI_MATKEY_SHININESS, materials[a].shininess.value) == aiReturn_SUCCESS;
    materials[a].transparency.exist = mat->Get( AI_MATKEY_OPACITY, materials[a].transparency.value) == aiReturn_SUCCESS;
    materials[a].index_refraction.exist = mat->Get( AI_MATKEY_REFRACTI, materials[a].index_refraction.value) == aiReturn_SUCCESS;
  }

  // output textures if present
  if( numTextures > 0 )
  {
    mOutput << startstr << "<library_images>" << endstr;
    PushTag();
    for( std::vector<Material>::const_iterator it = materials.begin(); it != materials.end(); ++it )
    {
      const Material& mat = *it;
      WriteImageEntry( mat.ambient, mat.name + "-ambient-image");
      WriteImageEntry( mat.diffuse, mat.name + "-diffuse-image");
      WriteImageEntry( mat.specular, mat.name + "-specular-image");
      WriteImageEntry( mat.emissive, mat.name + "-emission-image");
      WriteImageEntry( mat.reflective, mat.name + "-reflective-image");
      WriteImageEntry( mat.transparent, mat.name + "-transparent-image");
      WriteImageEntry( mat.normal, mat.name + "-normal-image");
    }
    PopTag();
    mOutput << startstr << "</library_images>" << endstr;
  }

  // output effects - those are the actual carriers of information
  if( !materials.empty() )
  {
    mOutput << startstr << "<library_effects>" << endstr;
    PushTag();
    for( std::vector<Material>::const_iterator it = materials.begin(); it != materials.end(); ++it )
    {
      const Material& mat = *it;
      // this is so ridiculous it must be right
      mOutput << startstr << "<effect id=\"" << XMLEscape(mat.name) << "-fx\" name=\"" << XMLEscape(mat.name) << "\">" << endstr;
      PushTag();
      mOutput << startstr << "<profile_COMMON>" << endstr;
      PushTag();

      // write sampler- and surface params for the texture entries
      WriteTextureParamEntry( mat.emissive, "emission", mat.name);
      WriteTextureParamEntry( mat.ambient, "ambient", mat.name);
      WriteTextureParamEntry( mat.diffuse, "diffuse", mat.name);
      WriteTextureParamEntry( mat.specular, "specular", mat.name);
      WriteTextureParamEntry( mat.reflective, "reflective", mat.name);
      WriteTextureParamEntry( mat.transparent, "transparent", mat.name);
      WriteTextureParamEntry( mat.normal, "normal", mat.name);

      mOutput << startstr << "<technique sid=\"standard\">" << endstr;
      PushTag();
      mOutput << startstr << "<" << mat.shading_model << ">" << endstr;
      PushTag();

      WriteTextureColorEntry( mat.emissive, "emission", mat.name + "-emission-sampler");
      WriteTextureColorEntry( mat.ambient, "ambient", mat.name + "-ambient-sampler");
      WriteTextureColorEntry( mat.diffuse, "diffuse", mat.name + "-diffuse-sampler");
      WriteTextureColorEntry( mat.specular, "specular", mat.name + "-specular-sampler");
      WriteFloatEntry(mat.shininess, "shininess");
      WriteTextureColorEntry( mat.reflective, "reflective", mat.name + "-reflective-sampler");
      WriteTextureColorEntry( mat.transparent, "transparent", mat.name + "-transparent-sampler");
      WriteFloatEntry(mat.transparency, "transparency");
      WriteFloatEntry(mat.index_refraction, "index_of_refraction");

      if(! mat.normal.texture.empty()) {
        WriteTextureColorEntry( mat.normal, "bump", mat.name + "-normal-sampler");
      }

      PopTag();
      mOutput << startstr << "</" << mat.shading_model << ">" << endstr;
      PopTag();
      mOutput << startstr << "</technique>" << endstr;
      PopTag();
      mOutput << startstr << "</profile_COMMON>" << endstr;
      PopTag();
      mOutput << startstr << "</effect>" << endstr;
    }
    PopTag();
    mOutput << startstr << "</library_effects>" << endstr;

    // write materials - they're just effect references
    mOutput << startstr << "<library_materials>" << endstr;
    PushTag();
    for( std::vector<Material>::const_iterator it = materials.begin(); it != materials.end(); ++it )
    {
      const Material& mat = *it;
      mOutput << startstr << "<material id=\"" << XMLEscape(mat.name) << "\" name=\"" << mat.name << "\">" << endstr;
      PushTag();
      mOutput << startstr << "<instance_effect url=\"#" << XMLEscape(mat.name) << "-fx\"/>" << endstr;
      PopTag();
      mOutput << startstr << "</material>" << endstr;
    }
    PopTag();
    mOutput << startstr << "</library_materials>" << endstr;
  }
}